

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O3

void __thiscall
Mustache::Renderer::readSetDelimiter(Renderer *this,QString *content,int pos,int endPos)

{
  char cVar1;
  long lVar2;
  char16_t *pcVar3;
  ulong uVar4;
  wchar32 wVar5;
  ulong uVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QString endMarker;
  QString startMarker;
  QString local_a8;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  
  local_68 = (QArrayData *)0x0;
  uStack_60 = 0;
  local_58 = 0;
  local_78 = 0;
  local_88 = (QArrayData *)0x0;
  uStack_80 = 0;
  pcVar3 = (content->d).ptr;
  lVar2 = (long)endPos;
  uVar6 = (long)pos;
  do {
    uVar4 = uVar6;
    wVar5 = (wchar32)(ushort)pcVar3[uVar4];
    if ((0x17 < (ushort)(wVar5 + L'\xfffffff7')) ||
       (cVar1 = '\x01', (0x80001fU >> (wVar5 + L'\xfffffff7' & 0x1fU) & 1) == 0)) {
      if ((uint)wVar5 < 0x80) goto LAB_00117d63;
      cVar1 = '\x01';
      if ((wVar5 != L'\x85') && (wVar5 != L'\xa0')) {
        cVar1 = QChar::isSpace_helper(wVar5);
      }
    }
    if ((lVar2 <= (long)uVar4) || (uVar6 = uVar4 + 1, cVar1 == '\0')) goto LAB_00117d63;
  } while( true );
LAB_00117dfe:
  uVar6 = uVar4;
  wVar5 = (wchar32)(ushort)pcVar3[uVar6];
  if ((0x17 < (ushort)(wVar5 + L'\xfffffff7')) ||
     (cVar1 = '\x01', (0x80001fU >> (wVar5 + L'\xfffffff7' & 0x1fU) & 1) == 0)) {
    if ((uint)wVar5 < 0x80) goto LAB_00117e2b;
    cVar1 = '\x01';
    if ((wVar5 != L'\x85') && (wVar5 != L'\xa0')) {
      cVar1 = QChar::isSpace_helper(wVar5);
    }
  }
  if ((lVar2 <= (long)uVar6) || (uVar4 = uVar6 + 1, cVar1 == '\0')) goto LAB_00117e2b;
  goto LAB_00117dfe;
LAB_00117e2b:
  uVar4 = uVar6 & 0xffffffff;
  do {
    if (((ushort)wVar5 < 0x21) && ((0x100003e00U >> ((ulong)(uint)wVar5 & 0x3f) & 1) != 0)) {
LAB_00117eaa:
      QString::operator=(&this->m_tagStartMarker,(QString *)&local_68);
      QString::operator=(&this->m_tagEndMarker,(QString *)&local_88);
      goto LAB_00117ecd;
    }
    if ((uint)wVar5 < 0x80) {
      cVar1 = '\0';
    }
    else {
      if ((wVar5 == L'\x85') || (wVar5 == L'\xa0')) goto LAB_00117eaa;
      cVar1 = QChar::isSpace_helper(wVar5);
    }
    if ((cVar1 != '\0') || ((long)(endPos + -1) <= (long)uVar6)) goto LAB_00117eaa;
    if (wVar5 == L'=') break;
    QString::append((QChar)(char16_t)&local_88);
    wVar5 = (wchar32)(ushort)(content->d).ptr[uVar6 + 1];
    uVar6 = uVar6 + 1;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while( true );
  QVar8.m_data = (storage_type *)0x26;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  local_a8.d.d = (Data *)local_48;
  local_a8.d.ptr = pcStack_40;
  local_a8.d.size = local_38;
  setError(this,&local_a8,(int)uVar4);
  goto LAB_00117f9c;
LAB_00117d63:
  uVar6 = uVar4 & 0xffffffff;
  while( true ) {
    if (((ushort)wVar5 < 0x21) && ((0x100003e00U >> ((ulong)(uint)wVar5 & 0x3f) & 1) != 0))
    goto LAB_00117dfe;
    if ((uint)wVar5 < 0x80) {
      cVar1 = '\0';
    }
    else {
      if ((wVar5 == L'\x85') || (wVar5 == L'\xa0')) goto LAB_00117dfe;
      cVar1 = QChar::isSpace_helper(wVar5);
    }
    if ((lVar2 <= (long)uVar4) || (cVar1 != '\0')) goto LAB_00117dfe;
    if (wVar5 == L'=') break;
    QString::append((QChar)(char16_t)&local_68);
    pcVar3 = (content->d).ptr;
    wVar5 = (wchar32)(ushort)pcVar3[uVar4 + 1];
    uVar4 = uVar4 + 1;
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  QVar7.m_data = (storage_type *)0x26;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar7);
  local_a8.d.d = (Data *)local_48;
  local_a8.d.ptr = pcStack_40;
  local_a8.d.size = local_38;
  setError(this,&local_a8,(int)uVar6);
LAB_00117f9c:
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
LAB_00117ecd:
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  return;
}

Assistant:

void Renderer::readSetDelimiter(const QString& content, int pos, int endPos)
{
	QString startMarker;
	QString endMarker;

	while (content.at(pos).isSpace() && pos < endPos) {
		++pos;
	}

	while (!content.at(pos).isSpace() && pos < endPos) {
		if (content.at(pos) == '=') {
			setError("Custom delimiters may not contain '='.", pos);
			return;
		}
		startMarker += content.at(pos);
		++pos;
	}

	while (content.at(pos).isSpace() && pos < endPos) {
		++pos;
	}

	while (!content.at(pos).isSpace() && pos < endPos - 1) {
		if (content.at(pos) == '=') {
			setError("Custom delimiters may not contain '='.", pos);
			return;
		}
		endMarker += content.at(pos);
		++pos;
	}

	m_tagStartMarker = startMarker;
	m_tagEndMarker = endMarker;
}